

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall QSplitterHandle::mousePressEvent(QSplitterHandle *this,QMouseEvent *e)

{
  long lVar1;
  MouseButton MVar2;
  int iVar3;
  QSplitterHandlePrivate *pQVar4;
  QPointF *in_RSI;
  QSplitterHandlePrivate *in_RDI;
  long in_FS_OFFSET;
  QSplitterHandlePrivate *d;
  QSplitterHandlePrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QSplitterHandle *)0x69950f);
  MVar2 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
  if (MVar2 == LeftButton) {
    this_00 = pQVar4;
    QSinglePointEvent::position((QSinglePointEvent *)0x699536);
    QPointF::toPoint(in_RSI);
    iVar3 = QSplitterHandlePrivate::pick(in_RDI,(QPoint *)this_00);
    pQVar4->mouseOffset = iVar3;
    pQVar4->field_0x268 = pQVar4->field_0x268 & 0xfb | 4;
    QWidget::update((QWidget *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterHandle::mousePressEvent(QMouseEvent *e)
{
    Q_D(QSplitterHandle);
    if (e->button() == Qt::LeftButton) {
        d->mouseOffset = d->pick(e->position().toPoint());
        d->pressed = true;
        update();
    }
}